

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpat.cpp
# Opt level: O0

void __thiscall CVmObjPattern::mark_refs(CVmObjPattern *this,uint state)

{
  vmobj_pat_ext *pvVar1;
  vm_val_t *pvVar2;
  CVmObjTable *in_RDI;
  vm_val_t *valp;
  uint in_stack_ffffffffffffffd8;
  vm_obj_id_t in_stack_ffffffffffffffdc;
  
  pvVar1 = get_ext((CVmObjPattern *)in_RDI);
  if (pvVar1 != (vmobj_pat_ext *)0x0) {
    pvVar2 = get_orig_str((CVmObjPattern *)0x32bd0c);
    if ((pvVar2->typ == VM_OBJ) && ((pvVar2->val).obj != 0)) {
      CVmObjTable::mark_all_refs(in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    }
  }
  return;
}

Assistant:

void CVmObjPattern::mark_refs(VMG_ uint state)
{
    const vm_val_t *valp;
    
    /* if our source value is an object reference, mark it */
    if (get_ext() != 0
        && (valp = get_orig_str())->typ == VM_OBJ
        && valp->val.obj != VM_INVALID_OBJ)
    {
        /* it's a reference, so mark it */
        G_obj_table->mark_all_refs(valp->val.obj, state);
    }
}